

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O1

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset,
              int depth)

{
  ulong uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pvVar7 = encoded.bytes;
  uVar8 = encoded.len;
  iVar6 = -2;
  if (100 < depth) {
    return -2;
  }
  sVar5 = *offset;
  uVar9 = sVar5 + 1;
  *offset = uVar9;
  if (uVar8 < uVar9) {
    return -2;
  }
  uVar2 = *(uint8_t *)((long)pvVar7 + sVar5);
  entry->kind = uVar2;
  switch(uVar2) {
  case 'A':
    iVar6 = amqp_decode_array(encoded,pool,&(entry->value).array,offset,depth + 1);
    return iVar6;
  case 'B':
    sVar5 = *offset;
    uVar9 = sVar5 + 1;
    *offset = uVar9;
    if (uVar8 < uVar9) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar7 + sVar5);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010e597_caseD_63;
  case 'D':
    sVar5 = *offset;
    uVar9 = sVar5 + 1;
    *offset = uVar9;
    if (uVar8 < uVar9) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar7 + sVar5);
    sVar5 = *offset;
    uVar9 = sVar5 + 4;
    *offset = uVar9;
    if (uVar8 < uVar9) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    (entry->value).decimal.value =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    break;
  case 'F':
    iVar6 = amqp_decode_table_internal(encoded,pool,&(entry->value).table,offset,depth + 1);
    return iVar6;
  case 'I':
    sVar5 = *offset;
    uVar9 = sVar5 + 4;
    *offset = uVar9;
    if (uVar9 <= uVar8) {
      uVar4 = *(uint *)((long)pvVar7 + sVar5);
      pool = (amqp_pool_t *)
             (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    );
    }
LAB_0010e725:
    if (uVar8 < uVar9) {
      return -2;
    }
    (entry->value).boolean = (amqp_boolean_t)pool;
    break;
  case 'L':
  case 'T':
switchD_0010e597_caseD_64:
    sVar5 = *offset;
    uVar9 = sVar5 + 8;
    *offset = uVar9;
    if (uVar8 < uVar9) {
      return -2;
    }
    uVar8 = *(ulong *)((long)pvVar7 + sVar5);
    (entry->value).u64 =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    break;
  case 'S':
switchD_0010e5c7_caseD_53:
    sVar5 = *offset;
    uVar9 = sVar5 + 4;
    *offset = uVar9;
    if (uVar8 < uVar9) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    uVar10 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    );
    uVar1 = uVar10 + uVar9;
    *offset = uVar1;
    if (uVar8 < uVar1) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar7 + uVar9);
    (entry->value).i64 = uVar10;
    break;
  case 'V':
    break;
  default:
    switch(uVar2) {
    case 'b':
      sVar5 = *offset;
      uVar9 = sVar5 + 1;
      *offset = uVar9;
      if (uVar8 < uVar9) {
        return -2;
      }
      (entry->value).i8 = *(int8_t *)((long)pvVar7 + sVar5);
      break;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010e597_caseD_63;
    case 'd':
      goto switchD_0010e597_caseD_64;
    case 'f':
    case 'i':
      sVar5 = *offset;
      uVar9 = sVar5 + 4;
      *offset = uVar9;
      if (uVar8 < uVar9) {
        return -2;
      }
      uVar4 = *(uint *)((long)pvVar7 + sVar5);
      (entry->value).u32 =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      break;
    case 'l':
      sVar5 = *offset;
      uVar9 = sVar5 + 8;
      *offset = uVar9;
      if (uVar8 < uVar9) {
        return -2;
      }
      uVar8 = *(ulong *)((long)pvVar7 + sVar5);
      (entry->value).u64 =
           uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      break;
    case 's':
      sVar5 = *offset;
      uVar9 = sVar5 + 2;
      *offset = uVar9;
      if (uVar8 < uVar9) {
        return -2;
      }
      uVar3 = *(ushort *)((long)pvVar7 + sVar5);
      (entry->value).u16 = uVar3 << 8 | uVar3 >> 8;
      break;
    case 't':
      sVar5 = *offset;
      uVar9 = sVar5 + 1;
      *offset = uVar9;
      pool = (amqp_pool_t *)0x0;
      if (uVar9 <= uVar8) {
        pool = (amqp_pool_t *)(ulong)(*(char *)((long)pvVar7 + sVar5) != '\0');
      }
      goto LAB_0010e725;
    case 'u':
      sVar5 = *offset;
      uVar9 = sVar5 + 2;
      *offset = uVar9;
      if (uVar8 < uVar9) {
        return -2;
      }
      uVar3 = *(ushort *)((long)pvVar7 + sVar5);
      (entry->value).u16 = uVar3 << 8 | uVar3 >> 8;
      break;
    default:
      if (uVar2 != 'x') {
        return -2;
      }
      goto switchD_0010e5c7_caseD_53;
    }
  }
  iVar6 = 0;
switchD_0010e597_caseD_63:
  return iVar6;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded, amqp_pool_t *pool,
                                   amqp_field_value_t *entry, size_t *offset,
                                   int depth) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (depth > TABLE_DEPTH_LIMIT) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits)                                          \
  if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; \
  break
#define SIMPLE_FIELD_DECODER(bits, dest, how)                 \
  {                                                           \
    uint##bits##_t val;                                       \
    if (!amqp_decode_##bits(encoded, offset, &val)) goto out; \
    entry->value.dest = how;                                  \
  }                                                           \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
    case AMQP_FIELD_KIND_U8:
      TRIVIAL_FIELD_DECODER(8);

    case AMQP_FIELD_KIND_I16:
      SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
    case AMQP_FIELD_KIND_U16:
      TRIVIAL_FIELD_DECODER(16);

    case AMQP_FIELD_KIND_I32:
      SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
    case AMQP_FIELD_KIND_U32:
      TRIVIAL_FIELD_DECODER(32);

    case AMQP_FIELD_KIND_I64:
      SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
    case AMQP_FIELD_KIND_U64:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_F32:
      TRIVIAL_FIELD_DECODER(32);
      /* and by punning, f32 magically gets the right value...! */

    case AMQP_FIELD_KIND_F64:
      TRIVIAL_FIELD_DECODER(64);
      /* and by punning, f64 magically gets the right value...! */

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals) ||
          !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES: {
      uint32_t len;
      if (!amqp_decode_32(encoded, offset, &len) ||
          !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
        goto out;
      }
      break;
    }

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_decode_array(encoded, pool, &(entry->value.array), offset,
                              depth + 1);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_decode_table_internal(encoded, pool, &(entry->value.table),
                                       offset, depth + 1);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}